

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

int __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::remove
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,char *__filename)

{
  BufHdr *pBVar1;
  bool bVar2;
  char *in_RDX;
  char *pcVar3;
  char *pcVar4;
  
  pcVar3 = (char *)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  pcVar4 = pcVar3;
  if (__filename < pcVar3 && in_RDX != (char *)0x0) {
    if (__filename == (char *)0x0) {
      pcVar4 = pcVar3 + -(long)in_RDX;
      if (pcVar3 < in_RDX || pcVar4 == (char *)0x0) {
        pBVar1 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
        if (pBVar1 != (BufHdr *)0x0) {
          if ((pBVar1->super_RefCount).m_refCount == 1) {
            (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
                 (C *)(pBVar1 + 1);
            *(undefined1 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
            (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
          }
          else {
            StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                      (&this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
          }
        }
        pcVar4 = (char *)0x0;
      }
      else {
        (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
             in_RDX + (long)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p
        ;
        (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length =
             (size_t)pcVar4;
      }
    }
    else if (in_RDX == (char *)0xffffffffffffffff || pcVar3 <= in_RDX + (long)__filename) {
      bVar2 = overrideLength(this,(size_t)__filename);
      pcVar4 = (char *)0xffffffffffffffff;
      if (bVar2) {
        pcVar4 = __filename;
      }
    }
    else {
      bVar2 = ensureExclusive(this);
      pcVar4 = (char *)0xffffffffffffffff;
      if (bVar2) {
        pcVar3 = pcVar3 + -(long)in_RDX;
        __wrap_memcpy(__filename +
                      (long)(this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p
                      ,in_RDX + (long)(__filename +
                                      (long)(this->
                                            super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>
                                            ).m_p),(long)pcVar3 - (long)__filename);
        bVar2 = overrideLength(this,(size_t)pcVar3);
        pcVar4 = (char *)0xffffffffffffffff;
        if (bVar2) {
          pcVar4 = pcVar3;
        }
      }
    }
  }
  return (int)pcVar4;
}

Assistant:

size_t
	remove(
		size_t index,
		size_t count = 1
	) {
		bool result;

		if (count == 0)
			return this->m_length;

		size_t oldLength = this->m_length;
		if (index >= oldLength)
			return oldLength;
		else if (index == 0)
			if (count >= oldLength) {
				clear();
				return 0;
			} else {
				this->m_p += count;
				this->m_length -= count;
				return this->m_length;
			}

		if (count == -1 || index + count >= oldLength) {
			result = overrideLength(index);
			return result ? index : -1;
		}

		result = ensureExclusive();
		if (!result)
			return -1;

		size_t newLength = oldLength - count;

		T* dst = this->m_p + index;
		Details::copy(dst, dst + count, newLength - index);

		result = overrideLength(newLength);
		return result ? newLength : -1;
	}